

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eval.c
# Opt level: O3

sexp sexp_identifier_eq_op(sexp ctx,sexp self,sexp_sint_t n,sexp e1,sexp id1,sexp e2,sexp id2)

{
  sexp psVar1;
  sexp psVar2;
  sexp psVar3;
  
  psVar1 = e1;
  if ((((((ulong)e1 & 3) == 0) && (e1->tag == 0x17)) && (psVar1 = e2, ((ulong)e2 & 3) == 0)) &&
     (e2->tag == 0x17)) {
    psVar1 = sexp_env_cell_loc(ctx,e1,id1,0,(sexp_conflict *)0x0);
    psVar2 = sexp_env_cell_loc(ctx,e2,id2,0,(sexp_conflict *)0x0);
    psVar3 = (sexp)&DAT_0000013e;
    if ((psVar1 == (sexp)0x0 || psVar1 != psVar2) &&
       (((id1 != id2 || (psVar1 != (sexp)0x0)) || (psVar2 != (sexp)0x0)))) {
      for (; (((ulong)id1 & 3) == 0 && (id1->tag == 0x16)); id1 = (id1->value).type.slots) {
      }
      for (; (((ulong)id2 & 3) == 0 && (id2->tag == 0x16)); id2 = (id2->value).type.slots) {
      }
      psVar3 = (sexp)((ulong)((psVar1 == (sexp)0x0 && id1 == id2) && psVar2 == (sexp)0x0) << 8 |
                     0x3e);
    }
    return psVar3;
  }
  psVar1 = sexp_type_exception(ctx,self,0x17,psVar1);
  return psVar1;
}

Assistant:

sexp sexp_identifier_eq_op (sexp ctx, sexp self, sexp_sint_t n, sexp e1, sexp id1, sexp e2, sexp id2) {
  sexp cell1, cell2;
  sexp_assert_type(ctx, sexp_envp, SEXP_ENV, e1);
  sexp_assert_type(ctx, sexp_envp, SEXP_ENV, e2);
  cell1 = sexp_env_cell(ctx, e1, id1, 0);
  cell2 = sexp_env_cell(ctx, e2, id2, 0);
  if (cell1 && (cell1 == cell2))
    return SEXP_TRUE;
  else if (!cell1 && !cell2 && (id1 == id2))
    return SEXP_TRUE;
  /* If the symbols are the same and the cells are either unbound or
   * (optionally) bound to top-level variables, consider them the
   * same.  Local (non-toplevel) bindings must still match exactly.
   */
  while (sexp_synclop(id1))
    id1 = sexp_synclo_expr(id1);
  while (sexp_synclop(id2))
    id2 = sexp_synclo_expr(id2);
  if ((id1 == id2)
      && ((!cell1 && !cell2)
#if !SEXP_USE_STRICT_TOPLEVEL_BINDINGS
          || ((!cell1 || (!sexp_lambdap(sexp_cdr(cell1)) &&
                         !sexp_env_cell_syntactic_p(cell1))) &&
              (!cell2 || (!sexp_lambdap(sexp_cdr(cell2)) &&
                          !sexp_env_cell_syntactic_p(cell2))))
#endif
              ))
    return SEXP_TRUE;
  return SEXP_FALSE;
}